

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  LogFile *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  allocator<char> local_31;
  string local_30 [16];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  this = (LogFile *)operator_new(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  liblogger::LogFile::LogFile(this,local_30);
  liblogger::LogManager::Add((ILogger *)this);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  examples();
  liblogger::LogManager::RemoveAll();
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	LogManager::Add(new LogFile("/proc/self/fd/1"));

	examples();

	LogManager::RemoveAll();
	return 0;
}